

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCoordinatesTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::TessCoordTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TessCoordTestInstance *this)

{
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coords;
  VkAccessFlags *pVVar1;
  SpacingMode SVar2;
  pointer pVVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var4;
  undefined8 *puVar5;
  int *piVar6;
  TestLog *log;
  bool bVar7;
  undefined8 uVar8;
  VkDeviceSize size;
  undefined8 renderPass;
  undefined8 pipelineLayout;
  undefined8 commandBuffer;
  void *pvVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Allocation *pAVar12;
  pointer pvVar13;
  bool bVar14;
  bool bVar15;
  deUint32 queueFamilyIndex;
  int iVar16;
  int iVar17;
  DeviceInterface *pDVar18;
  VkDevice device;
  Allocator *allocator;
  DescriptorSetLayoutBuilder *pDVar19;
  DescriptorPoolBuilder *pDVar20;
  DescriptorSetUpdateBuilder *pDVar21;
  const_iterator cVar22;
  GraphicsPipelineBuilder *pGVar23;
  TestLog *pTVar24;
  ulong uVar25;
  TessPrimitiveType TVar26;
  ulong uVar27;
  pointer pvVar28;
  Surface *pSVar29;
  pointer pTVar30;
  uint uVar31;
  pointer pvVar32;
  void *__buf;
  void *__buf_00;
  int iVar33;
  pointer pVVar34;
  int tessLevelCaseNdx;
  long lVar35;
  float *outerLevels;
  size_type sVar36;
  long lVar37;
  void **ppvVar38;
  VkBufferMemoryBarrier *pVVar39;
  undefined1 auVar40 [16];
  vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
  tessLevelCases;
  key_type local_670;
  key_type local_650;
  VkDeviceSize local_630;
  TestStatus *local_628;
  int local_620;
  uint local_61c;
  DeviceInterface *local_618;
  size_type local_610;
  VkBufferMemoryBarrier shaderWriteBarrier;
  TextureFormat local_5c8;
  ios_base local_590 [132];
  deUint32 local_50c;
  bool local_508;
  VkPrimitiveTopology local_504;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> resultTessCoords;
  long local_468;
  long *plStack_460;
  VkAccessFlags local_458;
  VkAccessFlags VStack_454;
  deUint32 dStack_450;
  deUint32 dStack_44c;
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  allReferenceTessCoords;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_400;
  VkQueue local_3e0;
  size_type local_3d8;
  ulong local_3d0;
  int inner;
  int iStack_3c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b8;
  _Alloc_hider local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398 [6];
  Surface resVisual;
  Surface refVisual;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_300;
  VkDescriptorSetLayout local_2e8;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_2e0;
  Buffer local_2c8;
  VkPipeline local_298;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_290;
  VkCommandPool local_278;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_270;
  VkFramebuffer local_258;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_250;
  VkDescriptorPool local_238;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_230;
  VkDescriptorBufferInfo resultBufferInfo;
  VkDescriptorBufferInfo tessLevelsBufferInfo;
  Buffer local_1e8;
  int outer [3];
  int iStack_1ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [272];
  
  local_628 = __return_storage_ptr__;
  pDVar18 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_3e0 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  SVar2 = this->m_spacingMode;
  local_618 = pDVar18;
  if (SVar2 == SPACINGMODE_EQUAL) {
    std::vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>::
    vector<vkt::tessellation::TessLevels_const*,void>
              ((vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>
                *)&tessLevelCases,
               (TessLevels *)
               tessellation::(anonymous_namespace)::
               genTessLevelCases(vkt::tessellation::TessPrimitiveType,vkt::tessellation::SpacingMode)
               ::rawTessLevelCases,(TessLevels *)"winding",(allocator_type *)&shaderWriteBarrier);
  }
  else {
    TVar26 = this->m_primitiveType;
    tessLevelCases.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tessLevelCases.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    tessLevelCases.
    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
    reserve(&tessLevelCases,9);
    lVar35 = 0;
    do {
      shaderWriteBarrier._16_8_ =
           *(undefined8 *)
            (tessellation::(anonymous_namespace)::
             genTessLevelCases(vkt::tessellation::TessPrimitiveType,vkt::tessellation::SpacingMode)
             ::rawTessLevelCases + lVar35 * 0x18 + 0x10);
      shaderWriteBarrier._0_8_ =
           *(undefined8 *)
            (tessellation::(anonymous_namespace)::
             genTessLevelCases(vkt::tessellation::TessPrimitiveType,vkt::tessellation::SpacingMode)
             ::rawTessLevelCases + lVar35 * 0x18);
      shaderWriteBarrier.pNext =
           *(void **)(tessellation::(anonymous_namespace)::
                      genTessLevelCases(vkt::tessellation::TessPrimitiveType,vkt::tessellation::SpacingMode)
                      ::rawTessLevelCases + lVar35 * 0x18 + 8);
      pVVar39 = &shaderWriteBarrier;
      bVar14 = true;
      do {
        bVar15 = bVar14;
        iVar16 = getClampedRoundedTessLevel(SVar2,(float)pVVar39->sType);
        pVVar39->sType = (VkStructureType)(float)iVar16;
        pVVar39 = (VkBufferMemoryBarrier *)&shaderWriteBarrier.field_0x4;
        bVar14 = false;
      } while (bVar15);
      lVar37 = 2;
      do {
        iVar16 = getClampedRoundedTessLevel(SVar2,(float)(&shaderWriteBarrier.sType)[lVar37]);
        (&shaderWriteBarrier.sType)[lVar37] = (VkStructureType)(float)iVar16;
        lVar37 = lVar37 + 1;
      } while (lVar37 != 6);
      if (TVar26 == TESSPRIMITIVETYPE_TRIANGLES) {
        if (((1.0 < (float)shaderWriteBarrier.srcAccessMask ||
              (1.0 < shaderWriteBarrier.pNext._4_4_ || 1.0 < shaderWriteBarrier.pNext._0_4_)) &&
            ((float)shaderWriteBarrier.sType == 1.0)) && (!NAN((float)shaderWriteBarrier.sType))) {
          iVar16 = getClampedRoundedTessLevel(SVar2,1.1);
          shaderWriteBarrier.sType = (VkStructureType)(float)iVar16;
        }
      }
      else if (TVar26 == TESSPRIMITIVETYPE_QUADS) {
        auVar40._4_4_ = -(uint)(1.0 < shaderWriteBarrier.pNext._4_4_);
        auVar40._0_4_ = -(uint)(1.0 < shaderWriteBarrier.pNext._0_4_);
        auVar40._8_4_ = -(uint)(1.0 < (float)shaderWriteBarrier.srcAccessMask);
        auVar40._12_4_ = -(uint)(1.0 < (float)shaderWriteBarrier.dstAccessMask);
        iVar16 = movmskps(iVar16,auVar40);
        if (iVar16 != 0) {
          if (((float)shaderWriteBarrier.sType == 1.0) && (!NAN((float)shaderWriteBarrier.sType))) {
            iVar16 = getClampedRoundedTessLevel(SVar2,1.1);
            shaderWriteBarrier.sType = (VkStructureType)(float)iVar16;
          }
          if (((float)shaderWriteBarrier._4_4_ == 1.0) && (!NAN((float)shaderWriteBarrier._4_4_))) {
            iVar16 = getClampedRoundedTessLevel(SVar2,1.1);
            shaderWriteBarrier._4_4_ = (float)iVar16;
          }
        }
      }
      if (tessLevelCases.
          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          tessLevelCases.
          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>::
        _M_realloc_insert<vkt::tessellation::TessLevels_const&>
                  ((vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>
                    *)&tessLevelCases,
                   (iterator)
                   tessLevelCases.
                   super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                   ._M_impl.super__Vector_impl_data._M_finish,(TessLevels *)&shaderWriteBarrier);
      }
      else {
        (tessLevelCases.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish)->outer[2] =
             (float)shaderWriteBarrier.srcAccessMask;
        (tessLevelCases.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish)->outer[3] =
             (float)shaderWriteBarrier.dstAccessMask;
        (tessLevelCases.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish)->inner[0] = (float)shaderWriteBarrier.sType;
        (tessLevelCases.
         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish)->inner[1] = (float)shaderWriteBarrier._4_4_;
        *(void **)(tessLevelCases.
                   super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->outer = shaderWriteBarrier.pNext;
        tessLevelCases.
        super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             tessLevelCases.
             super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      lVar35 = lVar35 + 1;
    } while (lVar35 != 9);
  }
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::vector(&allReferenceTessCoords,
           ((long)tessLevelCases.
                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)tessLevelCases.
                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)&shaderWriteBarrier);
  if (tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar27 = 0;
    uVar25 = 1;
    do {
      pTVar30 = tessLevelCases.
                super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_start;
      TVar26 = this->m_primitiveType;
      SVar2 = this->m_spacingMode;
      outerLevels = tessLevelCases.
                    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar27].outer;
      bVar14 = isPatchDiscarded(TVar26,outerLevels);
      if (bVar14) {
LAB_007772da:
        shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        shaderWriteBarrier._4_4_ = 0;
        shaderWriteBarrier.pNext = (void *)0x0;
        shaderWriteBarrier.srcAccessMask = 0;
        shaderWriteBarrier.dstAccessMask = 0;
      }
      else if (TVar26 == TESSPRIMITIVETYPE_ISOLINES) {
        getClampedRoundedIsolineTessLevels(SVar2,outerLevels,outer);
        generateReferenceIsolineTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                   &shaderWriteBarrier,outer[0],outer[1]);
      }
      else if (TVar26 == TESSPRIMITIVETYPE_QUADS) {
        getClampedRoundedQuadTessLevels(SVar2,pTVar30[uVar27].inner,outerLevels,&inner,outer);
        generateReferenceQuadTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                   &shaderWriteBarrier,SVar2,inner,iStack_3c4,outer[0],outer[1],
                   (int)stack0xfffffffffffffe50,iStack_1ac);
      }
      else {
        if (TVar26 != TESSPRIMITIVETYPE_TRIANGLES) goto LAB_007772da;
        getClampedRoundedTriangleTessLevels(SVar2,pTVar30[uVar27].inner,outerLevels,&inner,outer);
        generateReferenceTriangleTessCoords
                  ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                   &shaderWriteBarrier,SVar2,inner,outer[0],outer[1],outer[2]);
      }
      pVVar34 = allReferenceTessCoords.
                super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar27].
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pVVar3 = allReferenceTessCoords.
               super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar27].
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      allReferenceTessCoords.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar27].
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)shaderWriteBarrier._0_8_;
      allReferenceTessCoords.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar27].
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)shaderWriteBarrier.pNext;
      allReferenceTessCoords.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar27].
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)shaderWriteBarrier._16_8_;
      shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      shaderWriteBarrier._4_4_ = 0;
      shaderWriteBarrier.pNext = (void *)0x0;
      shaderWriteBarrier.srcAccessMask = 0;
      shaderWriteBarrier.dstAccessMask = 0;
      if ((pVVar34 != (pointer)0x0) &&
         (operator_delete(pVVar34,(long)pVVar3 - (long)pVVar34), shaderWriteBarrier._0_8_ != 0)) {
        operator_delete((void *)shaderWriteBarrier._0_8_,
                        shaderWriteBarrier._16_8_ - shaderWriteBarrier._0_8_);
      }
      uVar27 = ((long)tessLevelCases.
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)tessLevelCases.
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      bVar14 = uVar25 <= uVar27;
      lVar35 = uVar27 - uVar25;
      uVar27 = uVar25;
      uVar25 = (ulong)((int)uVar25 + 1);
    } while (bVar14 && lVar35 != 0);
  }
  pDVar18 = local_618;
  pvVar28 = allReferenceTessCoords.
            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1;
  pvVar32 = allReferenceTessCoords.
            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar28 !=
      allReferenceTessCoords.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish &&
      allReferenceTessCoords.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      allReferenceTessCoords.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pVVar34 = ((allReferenceTessCoords.
                super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pVVar3 = (pvVar28->
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pvVar13 = pvVar28;
      if ((ulong)((long)(pvVar28->
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar3) <=
          (ulong)((long)(pvVar32->
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar34)) {
        pvVar13 = pvVar32;
        pVVar3 = pVVar34;
      }
      pVVar34 = pVVar3;
      pvVar32 = pvVar13;
      pvVar28 = pvVar28 + 1;
    } while (pvVar28 !=
             allReferenceTessCoords.
             super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  pVVar34 = (pvVar32->
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  pVVar3 = (pvVar32->
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  makeBufferCreateInfo((VkBufferCreateInfo *)&shaderWriteBarrier,0x18,0x20);
  tessellation::Buffer::Buffer
            (&local_1e8,pDVar18,device,allocator,(VkBufferCreateInfo *)&shaderWriteBarrier,
             (MemoryRequirement)0x1);
  local_630 = ((long)(((ulong)((long)pVVar34 - (long)pVVar3) >> 2) * -0x5555555500000000) >> 0x1c) +
              0x110;
  makeBufferCreateInfo((VkBufferCreateInfo *)&shaderWriteBarrier,local_630,0x20);
  tessellation::Buffer::Buffer
            (&local_2c8,pDVar18,device,allocator,(VkBufferCreateInfo *)&shaderWriteBarrier,
             (MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier);
  pDVar19 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      ((DescriptorSetLayoutBuilder *)&shaderWriteBarrier,
                       VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,2,(VkSampler *)0x0);
  pDVar19 = ::vk::DescriptorSetLayoutBuilder::addBinding
                      (pDVar19,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,4,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)outer,pDVar19,pDVar18,device,0);
  DStack_2e0.m_device = (VkDevice)local_1a8[0]._0_8_;
  DStack_2e0.m_allocator = (VkAllocationCallbacks *)local_1a8[0]._8_8_;
  local_2e8.m_internal._0_4_ = outer[0];
  local_2e8.m_internal._4_4_ = outer[1];
  DStack_2e0.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffe50;
  outer[0] = 0;
  outer[1] = 0;
  stack0xfffffffffffffe50 = (pointer)0x0;
  local_1a8[0]._M_allocated_capacity = (pointer)0x0;
  local_1a8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if (shaderWriteBarrier.size != 0) {
    operator_delete((void *)shaderWriteBarrier.size,(long)local_5c8 - shaderWriteBarrier.size);
  }
  if (shaderWriteBarrier._24_8_ != 0) {
    operator_delete((void *)shaderWriteBarrier._24_8_,
                    shaderWriteBarrier.offset - shaderWriteBarrier._24_8_);
  }
  if (shaderWriteBarrier._0_8_ != 0) {
    operator_delete((void *)shaderWriteBarrier._0_8_,
                    shaderWriteBarrier._16_8_ - shaderWriteBarrier._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)outer);
  pDVar20 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)outer,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar20 = ::vk::DescriptorPoolBuilder::addType(pDVar20,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&shaderWriteBarrier,pDVar20,pDVar18,device,1,1
            );
  DStack_230.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_230.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_238.m_internal = shaderWriteBarrier._0_8_;
  DStack_230.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  shaderWriteBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  shaderWriteBarrier._4_4_ = 0;
  shaderWriteBarrier.pNext = (void *)0x0;
  shaderWriteBarrier.srcAccessMask = 0;
  shaderWriteBarrier.dstAccessMask = 0;
  shaderWriteBarrier.srcQueueFamilyIndex = 0;
  shaderWriteBarrier.dstQueueFamilyIndex = 0;
  if (outer._0_8_ != 0) {
    operator_delete((void *)outer._0_8_,local_1a8[0]._M_allocated_capacity - outer._0_8_);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&shaderWriteBarrier,pDVar18,device,
                    local_238,local_2e8);
  local_458 = shaderWriteBarrier.srcAccessMask;
  VStack_454 = shaderWriteBarrier.dstAccessMask;
  dStack_450 = shaderWriteBarrier.srcQueueFamilyIndex;
  dStack_44c = shaderWriteBarrier.dstQueueFamilyIndex;
  local_468 = shaderWriteBarrier._0_8_;
  plStack_460 = (long *)shaderWriteBarrier.pNext;
  resultBufferInfo.buffer.m_internal =
       local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  resultBufferInfo.offset = 0;
  resultBufferInfo.range = local_630;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier);
  pDVar21 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      ((DescriptorSetUpdateBuilder *)&shaderWriteBarrier,(VkStructureType)local_468,
                       (void *)0x0,0);
  pDVar21 = (DescriptorSetUpdateBuilder *)
            ::vk::DescriptorSetUpdateBuilder::write
                      (pDVar21,(VkStructureType)local_468,&DAT_00000001,0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar21,pDVar18,device);
  if (shaderWriteBarrier.size != 0) {
    operator_delete((void *)shaderWriteBarrier.size,(long)local_5c8 - shaderWriteBarrier.size);
  }
  if (shaderWriteBarrier._24_8_ != 0) {
    operator_delete((void *)shaderWriteBarrier._24_8_,
                    shaderWriteBarrier.offset - shaderWriteBarrier._24_8_);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&shaderWriteBarrier);
  makeRenderPassWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&shaderWriteBarrier,pDVar18,device);
  renderPass = shaderWriteBarrier._0_8_;
  DStack_400.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_400.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  DStack_400.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  makeFramebufferWithoutAttachments
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&shaderWriteBarrier,pDVar18,device,
             (VkRenderPass)shaderWriteBarrier._0_8_);
  DStack_250.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_250.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_258.m_internal = shaderWriteBarrier._0_8_;
  DStack_250.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&shaderWriteBarrier,pDVar18,device,
                     local_2e8);
  pipelineLayout = shaderWriteBarrier._0_8_;
  DStack_300.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_300.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  DStack_300.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&shaderWriteBarrier,pDVar18,device,
                  queueFamilyIndex);
  DStack_270.m_device = (VkDevice)shaderWriteBarrier._16_8_;
  DStack_270.m_allocator = (VkAllocationCallbacks *)shaderWriteBarrier._24_8_;
  local_278.m_internal = shaderWriteBarrier._0_8_;
  DStack_270.m_deviceIface = (DeviceInterface *)shaderWriteBarrier.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&shaderWriteBarrier,pDVar18,device,
             (VkCommandPool)shaderWriteBarrier._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  uVar11 = shaderWriteBarrier._24_8_;
  uVar10 = shaderWriteBarrier._16_8_;
  pvVar9 = shaderWriteBarrier.pNext;
  commandBuffer = shaderWriteBarrier._0_8_;
  memset(&shaderWriteBarrier,0,0xfc);
  local_50c = 1;
  local_508 = false;
  local_504 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  _inner = (pointer)&local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&inner,"vert","");
  cVar22 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,(key_type *)&inner);
  pGVar23 = GraphicsPipelineBuilder::setShader
                      ((GraphicsPipelineBuilder *)&shaderWriteBarrier,pDVar18,device,
                       VK_SHADER_STAGE_VERTEX_BIT,*(ProgramBinary **)(cVar22._M_node + 2),
                       (VkSpecializationInfo *)0x0);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"tesc","");
  cVar22 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,&local_670);
  pGVar23 = GraphicsPipelineBuilder::setShader
                      (pGVar23,pDVar18,device,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                       *(ProgramBinary **)(cVar22._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"tese","");
  cVar22 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var4,&local_650);
  pGVar23 = GraphicsPipelineBuilder::setShader
                      (pGVar23,pDVar18,device,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                       *(ProgramBinary **)(cVar22._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)outer,pGVar23,pDVar18,device,
             (VkPipelineLayout)pipelineLayout,(VkRenderPass)renderPass);
  DStack_290.m_device = (VkDevice)local_1a8[0]._0_8_;
  DStack_290.m_allocator = (VkAllocationCallbacks *)local_1a8[0]._8_8_;
  local_298.m_internal._0_4_ = outer[0];
  local_298.m_internal._4_4_ = outer[1];
  DStack_290.m_deviceIface = (DeviceInterface *)stack0xfffffffffffffe50;
  outer[0] = 0;
  outer[1] = 0;
  stack0xfffffffffffffe50 = (pointer)0x0;
  local_1a8[0]._M_allocated_capacity = (pointer)0x0;
  local_1a8[0]._8_8_ = (VkAllocationCallbacks *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_inner != &local_3b8) {
    operator_delete(_inner,(ulong)(local_3b8._M_allocated_capacity + 1));
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder((GraphicsPipelineBuilder *)&shaderWriteBarrier);
  uVar27 = 0;
  if (tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar25 = 0;
  }
  else {
    uVar27 = 0;
    uVar31 = 0;
    pTVar30 = tessLevelCases.
              super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      TVar26 = (TessPrimitiveType)pTVar30;
      ppvVar38 = &shaderWriteBarrier.pNext;
      shaderWriteBarrier._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      local_61c = uVar31;
      local_3d0 = uVar27;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppvVar38,"Tessellation levels: ",0x15);
      getTessellationLevelsString_abi_cxx11_
                ((string *)outer,
                 (tessellation *)
                 (tessLevelCases.
                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar27),
                 (TessLevels *)(ulong)this->m_primitiveType,TVar26);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppvVar38,(char *)outer._0_8_,(long)stack0xfffffffffffffe50);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&shaderWriteBarrier,(EndMessageToken *)&tcu::TestLog::EndMessage)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outer._0_8_ != local_1a8) {
        operator_delete((void *)outer._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar38);
      std::ios_base::~ios_base(local_590);
      puVar5 = (undefined8 *)
               (local_1e8.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr;
      puVar5[2] = *(undefined8 *)
                   (tessLevelCases.
                    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar27].outer + 2);
      uVar8 = *(undefined8 *)
               tessLevelCases.
               super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar27].outer;
      *puVar5 = *(undefined8 *)
                 tessLevelCases.
                 super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar27].inner;
      puVar5[1] = uVar8;
      ::vk::flushMappedMemoryRange
                (pDVar18,device,
                 (VkDeviceMemory)
                 ((local_1e8.m_allocation.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_memory).m_internal,
                 (local_1e8.m_allocation.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_offset,0x18);
      pAVar12 = local_2c8.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      size = local_630;
      memset((local_2c8.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr,0,local_630);
      ::vk::flushMappedMemoryRange
                (pDVar18,device,(VkDeviceMemory)(pAVar12->m_memory).m_internal,pAVar12->m_offset,
                 size);
      beginCommandBuffer(pDVar18,(VkCommandBuffer)commandBuffer);
      beginRenderPassWithRasterizationDisabled
                (pDVar18,(VkCommandBuffer)commandBuffer,(VkRenderPass)renderPass,local_258);
      (*pDVar18->_vptr_DeviceInterface[0x4c])(pDVar18,commandBuffer,0,local_298.m_internal);
      (*pDVar18->_vptr_DeviceInterface[0x56])
                (pDVar18,commandBuffer,0,pipelineLayout,0,1,&local_468,0,0);
      (*pDVar18->_vptr_DeviceInterface[0x59])(pDVar18,commandBuffer,1,1,0,0);
      endRenderPass(pDVar18,(VkCommandBuffer)commandBuffer);
      makeBufferMemoryBarrier
                (&shaderWriteBarrier,0x40,0x2000,
                 (VkBuffer)
                 local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                 m_internal,0,local_630);
      (*pDVar18->_vptr_DeviceInterface[0x6d])
                (pDVar18,commandBuffer,0x8000,0x4000,0,0,0,1,&shaderWriteBarrier,0,0);
      endCommandBuffer(pDVar18,(VkCommandBuffer)commandBuffer);
      submitCommandsAndWait(pDVar18,device,local_3e0,(VkCommandBuffer)commandBuffer);
      pAVar12 = local_2c8.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      ::vk::invalidateMappedMemoryRange
                (pDVar18,device,
                 (VkDeviceMemory)
                 ((local_2c8.m_allocation.
                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_memory).m_internal,
                 (local_2c8.m_allocation.
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)
                 ->m_offset,local_630);
      piVar6 = (int *)pAVar12->m_hostPtr;
      iVar16 = *piVar6;
      sVar36 = (size_type)iVar16;
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
                (&resultTessCoords,sVar36,(allocator_type *)&shaderWriteBarrier);
      pvVar28 = allReferenceTessCoords.
                super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < iVar16) {
        lVar35 = 0;
        do {
          *(int *)((long)(resultTessCoords.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar35 + 8) =
               piVar6[6];
          *(undefined8 *)
           ((long)(resultTessCoords.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar35) =
               *(undefined8 *)(piVar6 + 4);
          lVar35 = lVar35 + 0xc;
          piVar6 = piVar6 + 4;
        } while (sVar36 * 0xc != lVar35);
      }
      iVar17 = (int)((ulong)((long)allReferenceTessCoords.
                                   super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar27].
                                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)allReferenceTessCoords.
                                  super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar27].
                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 2);
      iVar33 = iVar17 * -0x55555555;
      log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      shaderWriteBarrier._0_8_ = log;
      if (SBORROW4(iVar16,iVar33) == iVar16 + iVar17 * 0x55555555 < 0) {
        if (iVar16 == iVar33) {
          ppvVar38 = &shaderWriteBarrier.pNext;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar38);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar38,"Note: generated ",0x10);
          std::ostream::operator<<(ppvVar38,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar38," tessellation coordinates",0x19);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&shaderWriteBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
        }
        else {
          ppvVar38 = &shaderWriteBarrier.pNext;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar38);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar38,"Note: generated ",0x10);
          std::ostream::operator<<(ppvVar38,iVar16);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar38," coordinates (out of which ",0x1b);
          std::ostream::operator<<(ppvVar38,iVar33);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppvVar38," must be unique)",0x10);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&shaderWriteBarrier,
                     (EndMessageToken *)&tcu::TestLog::EndMessage);
        }
      }
      else {
        ppvVar38 = &shaderWriteBarrier.pNext;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar38,"Failure: generated ",0x13);
        std::ostream::operator<<(ppvVar38,iVar16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar38," coordinates, but the expected reference value is ",0x32);
        std::ostream::operator<<(ppvVar38,iVar33);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&shaderWriteBarrier,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderWriteBarrier.pNext);
      std::ios_base::~ios_base(local_590);
      ppvVar38 = &shaderWriteBarrier.pNext;
      if (this->m_primitiveType - TESSPRIMITIVETYPE_QUADS < 2) {
        shaderWriteBarrier._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar38,
                   "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively"
                   ,0x6c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&shaderWriteBarrier,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_007780f2:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar38);
        std::ios_base::~ios_base(local_590);
      }
      else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        shaderWriteBarrier._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar38,
                   "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively"
                   ,0x78);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&shaderWriteBarrier,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_007780f2;
      }
      TVar26 = this->m_primitiveType;
      tcu::Surface::Surface(&refVisual);
      local_620 = iVar33;
      tcu::Surface::Surface(&resVisual);
      coords = pvVar28 + uVar27;
      local_3d8 = sVar36;
      drawTessCoordVisualization(&refVisual,TVar26,coords);
      drawTessCoordVisualization(&resVisual,TVar26,&resultTessCoords);
      shaderWriteBarrier.sType = 0xffff0000;
      bVar14 = oneWayComparePointSets
                         (log,&refVisual,TVar26,coords,&resultTessCoords,"reference","result",
                          (RGBA *)&shaderWriteBarrier);
      shaderWriteBarrier.sType = 0xff0000ff;
      bVar15 = oneWayComparePointSets
                         (log,&resVisual,TVar26,&resultTessCoords,coords,"result","reference",
                          (RGBA *)&shaderWriteBarrier);
      ppvVar38 = &shaderWriteBarrier.pNext;
      if (!bVar14 || !bVar15) {
        outer._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(outer + 2));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(outer + 2),
                   "Note: in the following reference visualization, points that are missing in result point set are blue (if any)"
                   ,0x6d);
        pTVar24 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)outer,(EndMessageToken *)&tcu::TestLog::EndMessage);
        local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
        local_650._M_dataplus._M_p = (pointer)0x19;
        local_670._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_670,(ulong)&local_650);
        local_670.field_2._M_allocated_capacity = (size_type)local_650._M_dataplus._M_p;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 9) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 10) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0xb) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0xc) = 'V';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0xd) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0xe) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0xf) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0x10) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0x11) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0x12) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0x13) = 'z';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0x14) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0x15) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0x16) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0x17) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0x18) = 'n';
        *(undefined8 *)local_670._M_dataplus._M_p = 0x4373736554666552;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 8) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 9) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 10) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0xb) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0xc) = 'V';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0xd) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0xe) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p + 0xf) = 'u';
        local_670._M_string_length = (size_type)local_650._M_dataplus._M_p;
        local_670._M_dataplus._M_p[(long)local_650._M_dataplus._M_p] = '\0';
        local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
        local_610 = 0x21;
        local_650._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_650,(ulong)&local_610);
        local_650.field_2._M_allocated_capacity = local_610;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x10) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x11) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x12) = 'd';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x13) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x14) = 'v';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x15) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x16) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x17) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x18) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x19) = 'l';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x1a) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x1b) = 'z';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x1c) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x1d) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x1e) = 'i';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0x1f) = 'o';
        *(undefined8 *)local_650._M_dataplus._M_p = 0x636e657265666552;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 8) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 9) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 10) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0xb) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0xc) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0xd) = 's';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0xe) = 'C';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_650._M_dataplus._M_p + 0xf) = 'o';
        local_650._M_dataplus._M_p[0x20] = 'n';
        local_650._M_string_length = local_610;
        local_650._M_dataplus._M_p[local_610] = '\0';
        pSVar29 = &refVisual;
        tcu::LogImage::LogImage
                  ((LogImage *)&inner,&local_670,&local_650,pSVar29,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&inner,(int)pTVar24,__buf,(size_t)pSVar29);
        shaderWriteBarrier._0_8_ = pTVar24;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar38);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar38,
                   "Note: in the following result visualization, points that are missing in reference point set are red (if any)"
                   ,0x6c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&shaderWriteBarrier,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar38);
        std::ios_base::~ios_base(local_590);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3a8._M_p != local_398) {
          operator_delete(local_3a8._M_p,local_398[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_inner != &local_3b8) {
          operator_delete(_inner,(ulong)(local_3b8._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_650._M_dataplus._M_p != &local_650.field_2) {
          operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_670._M_dataplus._M_p != &local_670.field_2) {
          operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(outer + 2));
        std::ios_base::~ios_base(local_140);
      }
      outer._0_8_ = local_1a8;
      _inner = (pointer)0x19;
      outer._0_8_ = std::__cxx11::string::_M_create((ulong *)outer,(ulong)&inner);
      local_1a8[0]._M_allocated_capacity = _inner;
      builtin_strncpy((char *)outer._0_8_,"ResTessCoordVisualization",0x19);
      stack0xfffffffffffffe50 = (pointer)_inner;
      *(char *)(outer._0_8_ + (long)_inner) = '\0';
      _inner = (pointer)&local_3b8;
      local_670._M_dataplus._M_p = (pointer)0x1e;
      _inner = (pointer)std::__cxx11::string::_M_create((ulong *)&inner,(ulong)&local_670);
      sVar36 = local_3d8;
      local_3b8._M_allocated_capacity = (size_type)local_670._M_dataplus._M_p;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xe) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xf) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x10) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x11) = 'v';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x12) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x13) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x14) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x15) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x16) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x17) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x18) = 'z';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x19) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1a) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1b) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1c) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1d) = 'n';
      *(undefined8 *)_inner = 0x7420746c75736552;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 8) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 9) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 10) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xb) = 'C';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xc) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xd) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xe) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xf) = 'd';
      local_3c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_670._M_dataplus._M_p;
      _inner[(long)local_670._M_dataplus._M_p] = '\0';
      pSVar29 = &resVisual;
      tcu::LogImage::LogImage
                ((LogImage *)&shaderWriteBarrier,(string *)outer,(string *)&inner,pSVar29,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&shaderWriteBarrier,(int)log,__buf_00,(size_t)pSVar29);
      if ((VkDeviceSize *)shaderWriteBarrier.buffer.m_internal != &shaderWriteBarrier.size) {
        operator_delete((void *)shaderWriteBarrier.buffer.m_internal,shaderWriteBarrier.size + 1);
      }
      if ((VkAccessFlags *)shaderWriteBarrier._0_8_ != &shaderWriteBarrier.srcAccessMask) {
        operator_delete((void *)shaderWriteBarrier._0_8_,shaderWriteBarrier._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_inner != &local_3b8) {
        operator_delete(_inner,(ulong)(local_3b8._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outer._0_8_ != local_1a8) {
        operator_delete((void *)outer._0_8_,(ulong)(local_1a8[0]._M_allocated_capacity + 1));
      }
      bVar7 = local_620 <= (int)sVar36;
      tcu::Surface::~Surface(&resVisual);
      tcu::Surface::~Surface(&refVisual);
      uVar27 = local_3d0;
      if (resultTessCoords.
          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(resultTessCoords.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)resultTessCoords.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)resultTessCoords.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      uVar31 = local_61c + (bVar7 && (bVar14 && bVar15));
      uVar27 = (ulong)((int)uVar27 + 1);
      pTVar30 = (pointer)0xaaaaaaaaaaaaaaab;
      uVar25 = ((long)tessLevelCases.
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)tessLevelCases.
                      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      pDVar18 = local_618;
    } while (uVar27 <= uVar25 && uVar25 - uVar27 != 0);
    uVar27 = (ulong)uVar31;
  }
  pVVar1 = &shaderWriteBarrier.srcAccessMask;
  shaderWriteBarrier._0_8_ = pVVar1;
  if (uVar25 == uVar27) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&shaderWriteBarrier,"OK","");
    local_628->m_code = QP_TEST_RESULT_PASS;
    (local_628->m_description)._M_dataplus._M_p = (pointer)&(local_628->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_628->m_description,shaderWriteBarrier._0_8_,
               (long)shaderWriteBarrier.pNext + shaderWriteBarrier._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&shaderWriteBarrier,"Some cases have failed","");
    local_628->m_code = QP_TEST_RESULT_FAIL;
    (local_628->m_description)._M_dataplus._M_p = (pointer)&(local_628->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_628->m_description,shaderWriteBarrier._0_8_,
               (long)shaderWriteBarrier.pNext + shaderWriteBarrier._0_8_);
  }
  if ((VkAccessFlags *)shaderWriteBarrier._0_8_ != pVVar1) {
    operator_delete((void *)shaderWriteBarrier._0_8_,shaderWriteBarrier._16_8_ + 1);
  }
  if (local_298.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_290,local_298);
  }
  if (commandBuffer != 0) {
    shaderWriteBarrier._0_8_ = commandBuffer;
    (**(code **)(*pvVar9 + 0x240))(pvVar9,uVar10,uVar11,1);
  }
  if (local_278.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_270,local_278);
  }
  if (pipelineLayout != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_300,(VkPipelineLayout)pipelineLayout);
  }
  if (local_258.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_250,local_258);
  }
  if (renderPass != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_400,(VkRenderPass)renderPass);
  }
  if (local_468 != 0) {
    shaderWriteBarrier._0_8_ = local_468;
    (**(code **)(*plStack_460 + 0x1e8))(plStack_460,_local_458,_dStack_450,1);
  }
  if (local_238.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_230,local_238);
  }
  if (local_2e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_2e0,local_2e8);
  }
  if (local_2c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_2c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_2c8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_2c8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (local_1e8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(local_1e8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
    local_1e8.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (local_1e8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0
     ) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&local_1e8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               local_1e8.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::~vector(&allReferenceTessCoords);
  if (tessLevelCases.
      super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(tessLevelCases.
                    super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)tessLevelCases.
                          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)tessLevelCases.
                          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return local_628;
}

Assistant:

tcu::TestStatus TessCoordTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Test data

	const std::vector<TessLevels>		 tessLevelCases			= genTessLevelCases(m_primitiveType, m_spacingMode);
	std::vector<std::vector<tcu::Vec3> > allReferenceTessCoords	(tessLevelCases.size());

	for (deUint32 i = 0; i < tessLevelCases.size(); ++i)
		allReferenceTessCoords[i] = generateReferenceTessCoords(m_primitiveType, m_spacingMode, &tessLevelCases[i].inner[0], &tessLevelCases[i].outer[0]);

	const size_t maxNumVertices = static_cast<int>(std::max_element(allReferenceTessCoords.begin(), allReferenceTessCoords.end(), SizeLessThan<std::vector<tcu::Vec3> >())->size());

	// Input buffer: tessellation levels. Data is filled in later.

	const Buffer tessLevelsBuffer(vk, device, allocator,
		makeBufferCreateInfo(sizeof(TessLevels), VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Output buffer: number of invocations + padding + tessellation coordinates. Initialized later.

	const int          resultBufferTessCoordsOffset	 = 4 * (int)sizeof(deInt32);
	const int          extraneousVertices			 = 16;	// allow some room for extraneous vertices from duplicate shader invocations (number is arbitrary)
	const VkDeviceSize resultBufferSizeBytes		 = resultBufferTessCoordsOffset + (maxNumVertices + extraneousVertices)*sizeof(tcu::Vec4);
	const Buffer       resultBuffer					 (vk, device, allocator, makeBufferCreateInfo(resultBufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Descriptors

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	const VkDescriptorBufferInfo tessLevelsBufferInfo = makeDescriptorBufferInfo(tessLevelsBuffer.get(), 0ull, sizeof(TessLevels));
	const VkDescriptorBufferInfo resultBufferInfo     = makeDescriptorBufferInfo(resultBuffer.get(), 0ull, resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &tessLevelsBufferInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultBufferInfo)
		.update(vk, device);

	// Pipeline: set up vertex processing without rasterization

	const Unique<VkRenderPass>		renderPass		(makeRenderPassWithoutAttachments (vk, device));
	const Unique<VkFramebuffer>		framebuffer		(makeFramebufferWithoutAttachments(vk, device, *renderPass));
	const Unique<VkPipelineLayout>	pipelineLayout	(makePipelineLayout(vk, device, *descriptorSetLayout));
	const Unique<VkCommandPool>		cmdPool			(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline(GraphicsPipelineBuilder()
		.setShader(vk, device, VK_SHADER_STAGE_VERTEX_BIT,					m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), DE_NULL)
		.build    (vk, device, *pipelineLayout, *renderPass));

	deUint32 numPassedCases = 0;

	// Repeat the test for all tessellation coords cases
	for (deUint32 tessLevelCaseNdx = 0; tessLevelCaseNdx < tessLevelCases.size(); ++tessLevelCaseNdx)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Tessellation levels: " << getTessellationLevelsString(tessLevelCases[tessLevelCaseNdx], m_primitiveType)
			<< tcu::TestLog::EndMessage;

		// Upload tessellation levels data to the input buffer
		{
			const Allocation& alloc = tessLevelsBuffer.getAllocation();
			TessLevels* const bufferTessLevels = static_cast<TessLevels*>(alloc.getHostPtr());
			*bufferTessLevels = tessLevelCases[tessLevelCaseNdx];
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), sizeof(TessLevels));
		}

		// Clear the results buffer
		{
			const Allocation& alloc = resultBuffer.getAllocation();
			deMemset(alloc.getHostPtr(), 0, static_cast<std::size_t>(resultBufferSizeBytes));
			flushMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), resultBufferSizeBytes);
		}

		// Reset the command buffer and begin recording.
		beginCommandBuffer(vk, *cmdBuffer);
		beginRenderPassWithRasterizationDisabled(vk, *cmdBuffer, *renderPass, *framebuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		// Process a single abstract vertex.
		vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
		endRenderPass(vk, *cmdBuffer);

		{
			const VkBufferMemoryBarrier shaderWriteBarrier = makeBufferMemoryBarrier(
				VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *resultBuffer, 0ull, resultBufferSizeBytes);

			vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
				0u, DE_NULL, 1u, &shaderWriteBarrier, 0u, DE_NULL);
		}

		endCommandBuffer(vk, *cmdBuffer);
		submitCommandsAndWait(vk, device, queue, *cmdBuffer);

		// Verify results
		{
			const Allocation& resultAlloc = resultBuffer.getAllocation();
			invalidateMappedMemoryRange(vk, device, resultAlloc.getMemory(), resultAlloc.getOffset(), resultBufferSizeBytes);

			const deInt32					numResults			= *static_cast<deInt32*>(resultAlloc.getHostPtr());
			const std::vector<tcu::Vec3>	resultTessCoords    = readInterleavedData<tcu::Vec3>(numResults, resultAlloc.getHostPtr(), resultBufferTessCoordsOffset, sizeof(tcu::Vec4));
			const std::vector<tcu::Vec3>&	referenceTessCoords = allReferenceTessCoords[tessLevelCaseNdx];
			const int						numExpectedResults  = static_cast<int>(referenceTessCoords.size());
			tcu::TestLog&					log					= m_context.getTestContext().getLog();

			if (numResults < numExpectedResults)
			{
				log << tcu::TestLog::Message
					<< "Failure: generated " << numResults << " coordinates, but the expected reference value is " << numExpectedResults
					<< tcu::TestLog::EndMessage;
			}
			else if (numResults == numExpectedResults)
				log << tcu::TestLog::Message << "Note: generated " << numResults << " tessellation coordinates" << tcu::TestLog::EndMessage;
			else
			{
				log << tcu::TestLog::Message
					<< "Note: generated " << numResults << " coordinates (out of which " << numExpectedResults << " must be unique)"
					<< tcu::TestLog::EndMessage;
			}

			if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
				log << tcu::TestLog::Message << "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively" << tcu::TestLog::EndMessage;
			else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS || m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				log << tcu::TestLog::Message << "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively" << tcu::TestLog::EndMessage;
			else
				DE_ASSERT(false);

			if (compareTessCoords(log, m_primitiveType, referenceTessCoords, resultTessCoords) && (numResults >= numExpectedResults))
				++numPassedCases;
		}
	}  // for tessLevelCaseNdx

	return (numPassedCases == tessLevelCases.size() ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Some cases have failed"));
}